

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_sasl_mechanisms(SASL_MECHANISMS_HANDLE sasl_mechanisms)

{
  SASL_MECHANISMS_INSTANCE *sasl_mechanisms_instance;
  AMQP_VALUE result;
  SASL_MECHANISMS_HANDLE sasl_mechanisms_local;
  
  if (sasl_mechanisms == (SASL_MECHANISMS_HANDLE)0x0) {
    sasl_mechanisms_instance = (SASL_MECHANISMS_INSTANCE *)0x0;
  }
  else {
    sasl_mechanisms_instance =
         (SASL_MECHANISMS_INSTANCE *)amqpvalue_clone(sasl_mechanisms->composite_value);
  }
  return (AMQP_VALUE)sasl_mechanisms_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_sasl_mechanisms(SASL_MECHANISMS_HANDLE sasl_mechanisms)
{
    AMQP_VALUE result;

    if (sasl_mechanisms == NULL)
    {
        result = NULL;
    }
    else
    {
        SASL_MECHANISMS_INSTANCE* sasl_mechanisms_instance = (SASL_MECHANISMS_INSTANCE*)sasl_mechanisms;
        result = amqpvalue_clone(sasl_mechanisms_instance->composite_value);
    }

    return result;
}